

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_options.cpp
# Opt level: O0

ConfigIter Clasp::Cli::ClaspCliConfig::getConfig(ConfigKey k)

{
  uint in_EDI;
  ConfigIter local_8;
  
  switch(in_EDI) {
  case 1:
    ConfigIter::ConfigIter(&local_8,"/[tweety]");
    break;
  case 2:
    ConfigIter::ConfigIter(&local_8,"/[trendy]");
    break;
  case 3:
    ConfigIter::ConfigIter(&local_8,"/[frumpy]");
    break;
  case 4:
    ConfigIter::ConfigIter(&local_8,"/[crafty]");
    break;
  case 5:
    ConfigIter::ConfigIter(&local_8,"/[jumpy]");
    break;
  case 6:
    ConfigIter::ConfigIter(&local_8,"/[handy]");
    break;
  default:
    if (in_EDI != 0) {
      Potassco::fail(-2,"static ConfigIter Clasp::Cli::ClaspCliConfig::getConfig(ConfigKey)",0x2d5,
                     "k == config_default","Invalid config key \'%d\'",(ulong)in_EDI,0);
    }
    ConfigIter::ConfigIter(&local_8,"/default");
    break;
  case 8:
    ConfigIter::ConfigIter(&local_8,"/[s6]");
    break;
  case 9:
    ConfigIter::ConfigIter(&local_8,"/[s7]");
    break;
  case 10:
    ConfigIter::ConfigIter(&local_8,"/[s8]");
    break;
  case 0xb:
    ConfigIter::ConfigIter(&local_8,"/[s9]");
    break;
  case 0xc:
    ConfigIter::ConfigIter(&local_8,"/[s10]");
    break;
  case 0xd:
    ConfigIter::ConfigIter(&local_8,"/[s11]");
    break;
  case 0xe:
    ConfigIter::ConfigIter(&local_8,"/[s12]");
    break;
  case 0xf:
    ConfigIter::ConfigIter(&local_8,"/[s13]");
    break;
  case 0x10:
    ConfigIter::ConfigIter(&local_8,"/[nolearn]");
    break;
  case 0x11:
    ConfigIter::ConfigIter(&local_8,"/[tester]");
    break;
  case 0x13:
    ConfigIter::ConfigIter(&local_8,"/[solver.0]");
  }
  return (ConfigIter)local_8.base_;
}

Assistant:

ConfigIter ClaspCliConfig::getConfig(ConfigKey k) {
	#define MAKE_CONFIG(n, o1, o2) "/[" n "]\0/\0/" o1 " " o2 "\0"
	switch(k) {
		#define CONFIG(id, n,c,s,p) case config_##n: return ConfigIter(MAKE_CONFIG(#n, s, c));
		#define CLASP_CLI_DEFAULT_CONFIGS
		#define CLASP_CLI_AUX_CONFIGS
		#include <clasp/cli/clasp_cli_configs.inl>
		case config_many:
		#define CONFIG(id,n,c,s,p) MAKE_CONFIG("solver." POTASSCO_STRING(id), c, p)
		#define CLASP_CLI_DEFAULT_CONFIGS
		#define CLASP_CLI_AUX_CONFIGS
			return ConfigIter(
				#include <clasp/cli/clasp_cli_configs.inl>
			);
		default: POTASSCO_REQUIRE(k == config_default, "Invalid config key '%d'", (int)k); return ConfigIter("/default\0/\0/\0");
	}
	#undef MAKE_CONFIG
}